

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

Move __thiscall banksia::ChessBoard::fromSanString(ChessBoard *this,string *str)

{
  Move MVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  reference pcVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  size_type sVar9;
  undefined8 in_RSI;
  long *in_RDI;
  bool incheck;
  Hist hist;
  MoveFull move;
  Move *m_1;
  iterator __end4;
  iterator __begin4;
  vector<banksia::Move,_std::allocator<banksia::Move>_> *__range4;
  MoveFull *m;
  iterator __end3;
  iterator __begin3;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *__range3;
  vector<banksia::Move,_std::allocator<banksia::Move>_> goodMoves;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> moveList;
  char ch_3;
  size_type left;
  char ch_2;
  int k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> destString;
  char ch_1;
  size_type p;
  PieceType promotion;
  PieceType pieceType;
  int fromRow;
  int fromCol;
  int dest;
  int from;
  char ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string s;
  BoardCore *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  byte in_stack_fffffffffffffd57;
  int in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  Piece in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd68;
  undefined3 uVar10;
  int in_stack_fffffffffffffd6c;
  BoardCore *this_00;
  undefined1 local_230 [148];
  undefined1 local_19c [20];
  reference local_188;
  Move *local_180;
  __normal_iterator<banksia::Move_*,_std::vector<banksia::Move,_std::allocator<banksia::Move>_>_>
  local_178;
  vector<banksia::Move,_std::allocator<banksia::Move>_> *local_170;
  Piece local_168;
  reference local_160;
  MoveFull *local_158;
  __normal_iterator<banksia::MoveFull_*,_std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>_>
  local_150;
  undefined1 *local_148;
  vector<banksia::Move,_std::allocator<banksia::Move>_> local_140;
  undefined1 local_128 [64];
  long local_e8;
  undefined1 local_dd;
  ReasonType local_dc;
  string local_d8 [32];
  string local_b8 [52];
  PieceType local_84;
  PieceType local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  char local_59;
  undefined8 local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_48;
  string local_40 [32];
  undefined8 local_20;
  Move local_c;
  
  local_20 = in_RSI;
  std::__cxx11::string::string(local_40);
  local_48 = local_20;
  local_50._M_current = (char *)std::__cxx11::string::begin();
  local_58 = std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffd48), bVar2) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_50);
    local_59 = *pcVar5;
    if ((((local_59 != '+') && (local_59 != 'x')) && (local_59 != '*')) && (local_59 != '#')) {
      if ((local_59 < ' ') || (local_59 == '.')) {
        local_59 = ' ';
      }
      std::__cxx11::string::operator+=(local_40,local_59);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_50);
  }
  local_70 = -1;
  local_74 = -1;
  local_78 = -1;
  local_7c = -1;
  local_80 = pawn;
  local_84 = empty;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                          (char *)in_stack_fffffffffffffd48);
  if ((bVar2) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                              (char *)in_stack_fffffffffffffd48), bVar2)) {
    iVar4 = 0x3c;
    if ((int)in_RDI[4] == 0) {
      iVar4 = 4;
    }
    local_70 = iVar4;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                            (char *)in_stack_fffffffffffffd48);
    local_74 = -2;
    if (bVar2) {
      local_74 = 2;
    }
    local_74 = iVar4 + local_74;
  }
  else {
    local_b8._40_8_ = std::__cxx11::string::find((char *)local_40,0x2051c8);
    if (local_b8._40_8_ != -1) {
      lVar6 = std::__cxx11::string::length();
      if (lVar6 == local_b8._40_8_ + 1) {
        local_c.from = Move::illegalMove.from;
        local_c.dest = Move::illegalMove.dest;
        local_c.promotion = Move::illegalMove.promotion;
        local_b8[0x24] = (string)0x1;
        local_b8[0x25] = (string)0x0;
        local_b8[0x26] = (string)0x0;
        local_b8[0x27] = (string)0x0;
        goto LAB_001edad9;
      }
      pcVar7 = (char *)std::__cxx11::string::at((ulong)local_40);
      local_b8[0x23] = (string)*pcVar7;
      local_84 = charToPieceType((ChessBoard *)
                                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                 in_stack_fffffffffffffd57);
      std::__cxx11::string::substr((ulong)local_b8,(ulong)local_40);
      std::__cxx11::string::operator=(local_40,local_b8);
      std::__cxx11::string::~string(local_b8);
      uVar8 = std::__cxx11::string::size();
      if ((uVar8 < 2) || (local_84 == empty)) {
        local_c.from = Move::illegalMove.from;
        local_c.dest = Move::illegalMove.dest;
        local_c.promotion = Move::illegalMove.promotion;
        local_b8[0x24] = (string)0x1;
        local_b8[0x25] = (string)0x0;
        local_b8[0x26] = (string)0x0;
        local_b8[0x27] = (string)0x0;
        goto LAB_001edad9;
      }
    }
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_d8,(ulong)local_40);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    local_74 = coordinateStringToPos(pcVar7);
    bVar3 = (**(code **)(*in_RDI + 0x30))(in_RDI,local_74);
    if ((bVar3 & 1) == 0) {
      local_c.from = Move::illegalMove.from;
      local_c.dest = Move::illegalMove.dest;
      local_c.promotion = Move::illegalMove.promotion;
      local_b8[0x24] = (string)0x1;
      local_b8[0x25] = (string)0x0;
      local_b8[0x26] = (string)0x0;
      local_b8[0x27] = (string)0x0;
    }
    else {
      uVar8 = std::__cxx11::string::length();
      if (2 < uVar8) {
        local_dc = noreason;
        pcVar7 = (char *)std::__cxx11::string::at((ulong)local_40);
        local_dd = *pcVar7;
        if (('@' < (char)local_dd) && ((char)local_dd < '[')) {
          local_dc = local_dc + mate;
          local_80 = charToPieceType((ChessBoard *)
                                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                     in_stack_fffffffffffffd57);
          if (local_80 == empty) {
            local_c.from = Move::illegalMove.from;
            local_c.dest = Move::illegalMove.dest;
            local_c.promotion = Move::illegalMove.promotion;
            local_b8[0x24] = (string)0x1;
            local_b8[0x25] = (string)0x0;
            local_b8[0x26] = (string)0x0;
            local_b8[0x27] = (string)0x0;
            goto LAB_001eda7f;
          }
        }
        lVar6 = std::__cxx11::string::length();
        local_e8 = (lVar6 - (int)local_dc) + -2;
        if (local_e8 != 0) {
          std::__cxx11::string::substr((ulong)(local_128 + 0x20),(ulong)local_40);
          std::__cxx11::string::operator=(local_40,(string *)(local_128 + 0x20));
          std::__cxx11::string::~string((string *)(local_128 + 0x20));
          if (local_e8 == 2) {
            pcVar7 = (char *)std::__cxx11::string::c_str();
            local_70 = coordinateStringToPos(pcVar7);
          }
          else {
            pcVar7 = (char *)std::__cxx11::string::at((ulong)local_40);
            local_128[0x1f] = *pcVar7;
            iVar4 = isdigit((int)local_128[0x1f]);
            if (iVar4 == 0) {
              if (('`' < local_128[0x1f]) && (local_128[0x1f] < '{')) {
                local_78 = local_128[0x1f] + -0x61;
              }
            }
            else {
              local_7c = 0x38 - local_128[0x1f];
            }
          }
        }
      }
      if (local_70 < 0) {
        this_00 = (BoardCore *)local_128;
        std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::vector
                  ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)0x1ed68e);
        (**(code **)(*in_RDI + 0x88))(in_RDI,this_00,(int)in_RDI[4]);
        std::vector<banksia::Move,_std::allocator<banksia::Move>_>::vector
                  ((vector<banksia::Move,_std::allocator<banksia::Move>_> *)0x1ed6b6);
        local_148 = local_128;
        local_150._M_current =
             (MoveFull *)
             std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::begin
                       ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)
                        in_stack_fffffffffffffd48);
        local_158 = (MoveFull *)
                    std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::end
                              ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)
                               in_stack_fffffffffffffd48);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<banksia::MoveFull_*,_std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                                  (__normal_iterator<banksia::MoveFull_*,_std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>_>
                                   *)in_stack_fffffffffffffd48), bVar2) {
          local_160 = __gnu_cxx::
                      __normal_iterator<banksia::MoveFull_*,_std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>_>
                      ::operator*(&local_150);
          uVar10 = (undefined3)in_stack_fffffffffffffd6c;
          in_stack_fffffffffffffd6c = CONCAT13(1,uVar10);
          if (((local_160->super_Move).dest == local_74) &&
             (in_stack_fffffffffffffd6c = CONCAT13(1,uVar10),
             (local_160->super_Move).promotion == local_84)) {
            in_stack_fffffffffffffd60 = BoardCore::getPiece(in_stack_fffffffffffffd48,0);
            local_168.type = in_stack_fffffffffffffd60.type;
            in_stack_fffffffffffffd6c =
                 CONCAT13(local_168.type != local_80,(int3)in_stack_fffffffffffffd6c);
            local_168 = in_stack_fffffffffffffd60;
          }
          if (((char)((uint)in_stack_fffffffffffffd6c >> 0x18) == '\0') &&
             ((((local_7c < 0 && (local_78 < 0)) ||
               ((-1 < local_7c &&
                (in_stack_fffffffffffffd5c =
                      (**(code **)(*in_RDI + 0x48))(in_RDI,(local_160->super_Move).from),
                in_stack_fffffffffffffd5c == local_7c)))) ||
              ((-1 < local_78 &&
               (in_stack_fffffffffffffd58 =
                     (**(code **)(*in_RDI + 0x40))(in_RDI,(local_160->super_Move).from),
               in_stack_fffffffffffffd58 == local_78)))))) {
            std::vector<banksia::Move,_std::allocator<banksia::Move>_>::push_back
                      ((vector<banksia::Move,_std::allocator<banksia::Move>_> *)
                       in_stack_fffffffffffffd60,
                       (value_type *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
            local_70 = (local_160->super_Move).from;
          }
          __gnu_cxx::
          __normal_iterator<banksia::MoveFull_*,_std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>_>
          ::operator++(&local_150);
        }
        sVar9 = std::vector<banksia::Move,_std::allocator<banksia::Move>_>::size(&local_140);
        if (1 < sVar9) {
          local_170 = &local_140;
          local_178._M_current =
               (Move *)std::vector<banksia::Move,_std::allocator<banksia::Move>_>::begin
                                 ((vector<banksia::Move,_std::allocator<banksia::Move>_> *)
                                  in_stack_fffffffffffffd48);
          local_180 = (Move *)std::vector<banksia::Move,_std::allocator<banksia::Move>_>::end
                                        ((vector<banksia::Move,_std::allocator<banksia::Move>_> *)
                                         in_stack_fffffffffffffd48);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<banksia::Move_*,_std::vector<banksia::Move,_std::allocator<banksia::Move>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50)
                                    ,(__normal_iterator<banksia::Move_*,_std::vector<banksia::Move,_std::allocator<banksia::Move>_>_>
                                      *)in_stack_fffffffffffffd48), bVar2) {
            local_188 = __gnu_cxx::
                        __normal_iterator<banksia::Move_*,_std::vector<banksia::Move,_std::allocator<banksia::Move>_>_>
                        ::operator*(&local_178);
            BoardCore::createFullMove
                      (this_00,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,
                       in_stack_fffffffffffffd60.side);
            Hist::Hist((Hist *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
            (**(code **)(*in_RDI + 0xa8))(in_RDI,local_19c,local_230);
            in_stack_fffffffffffffd57 = (**(code **)(*in_RDI + 0x98))(in_RDI,(int)in_RDI[4]);
            bVar3 = in_stack_fffffffffffffd57 & 1;
            (**(code **)(*in_RDI + 0xb0))(in_RDI,local_230);
            if (bVar3 == 0) {
              local_70 = local_188->from;
              local_b8[0x24] = (string)0x6;
              local_b8[0x25] = (string)0x0;
              local_b8[0x26] = (string)0x0;
              local_b8[0x27] = (string)0x0;
            }
            else {
              local_b8[0x24] = (string)0x0;
              local_b8[0x25] = (string)0x0;
              local_b8[0x26] = (string)0x0;
              local_b8[0x27] = (string)0x0;
            }
            Hist::~Hist((Hist *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
            if (local_b8._36_4_ != 0) break;
            __gnu_cxx::
            __normal_iterator<banksia::Move_*,_std::vector<banksia::Move,_std::allocator<banksia::Move>_>_>
            ::operator++(&local_178);
          }
        }
        std::vector<banksia::Move,_std::allocator<banksia::Move>_>::~vector
                  ((vector<banksia::Move,_std::allocator<banksia::Move>_> *)
                   in_stack_fffffffffffffd60);
        std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::~vector
                  ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)
                   in_stack_fffffffffffffd60);
      }
      local_b8[0x24] = (string)0x0;
      local_b8[0x25] = (string)0x0;
      local_b8[0x26] = (string)0x0;
      local_b8[0x27] = (string)0x0;
    }
LAB_001eda7f:
    std::__cxx11::string::~string(local_d8);
    if (local_b8._36_4_ != 0) goto LAB_001edad9;
  }
  Move::Move(&local_c,local_70,local_74,local_84);
  local_b8[0x24] = (string)0x1;
  local_b8[0x25] = (string)0x0;
  local_b8[0x26] = (string)0x0;
  local_b8[0x27] = (string)0x0;
LAB_001edad9:
  std::__cxx11::string::~string(local_40);
  MVar1.promotion = local_c.promotion;
  MVar1.from = local_c.from;
  MVar1.dest = local_c.dest;
  return MVar1;
}

Assistant:

Move ChessBoard::fromSanString(const std::string& str)
{
    std::string s;
    for(auto ch : str) {
        if (ch != '+' && ch != 'x' && ch != '*' && ch != '#') {
            if (ch < ' ' || ch == '.') ch = ' ';
            s += ch;
        }
    }
    
    int from = -1, dest = -1, fromCol = -1, fromRow = -1;
    auto pieceType = PieceType::pawn, promotion = PieceType::empty;
    
    if (s == "O-O" || s == "O-O-O") {
        from = side == Side::black ? 4 : 60;
        dest = from + (s == "O-O" ? 2 : -2);
    } else {
        auto p = s.find("=");
        if (p != std::string::npos) {
            if (s.length() == p + 1) {
                return Move::illegalMove; // something wrong
            }
            char ch = s.at(p + 1);
            promotion = charToPieceType(ch);
            assert(isValidPromotion(promotion));
            
            s = s.substr(0, p);
            if (s.size() < 2 || promotion == PieceType::empty) {
                return Move::illegalMove;;
            }
        }
        
        auto destString = s.substr(s.length() - 2, 2);
        dest = coordinateStringToPos(destString.c_str());
        
        if (!isPositionValid(dest)) {
            return Move::illegalMove;;
        }
        
        if (s.length() > 2) {
            auto k = 0;
            char ch = s.at(0);
            if (ch >= 'A' && ch <= 'Z') {
                k++;
                pieceType = charToPieceType(ch);
                
                if (pieceType == PieceType::empty) {
                    return Move::illegalMove;;
                }
            }
            
            auto left = s.length() - k - 2;
            if (left > 0) {
                s = s.substr(k, left);
                if (left == 2) {
                    from = coordinateStringToPos(s.c_str());
                } else {
                    char ch = s.at(0);
                    if (isdigit(ch)) {
                        fromRow = 8 - ch + '0';
                    } else if (ch >= 'a' && ch <= 'z') {
                        fromCol = ch - 'a';
                    }
                }
            }
        }
        
        if (from < 0) {
            std::vector<MoveFull> moveList;
            gen(moveList, side);
            
            std::vector<Move> goodMoves;
            for (auto && m : moveList) {
                if (m.dest != dest || m.promotion != promotion ||
                    getPiece(m.from).type != pieceType) {
                    continue;
                }
                
                if ((fromRow < 0 && fromCol < 0) ||
                    (fromRow >= 0 && getRow(m.from) == fromRow) ||
                    (fromCol >= 0 && getColumn(m.from) == fromCol)) {
                    goodMoves.push_back(m);
                    from = m.from;
                }
            }
            
            if (goodMoves.size() > 1) {
                for(auto && m : goodMoves) {
                    MoveFull move = createFullMove(m.from, dest, promotion);
                    Hist hist;
                    make(move, hist);
                    auto incheck = isIncheck(side);
                    takeBack(hist);
                    if (!incheck) {
                        from = m.from;
                        break;
                    }
                }
            }
        }
    }
    
    assert(isValidPromotion(promotion));
    return Move(from, dest, promotion);
}